

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdEmuEmuD3D0Config::emulate_mthd(MthdEmuEmuD3D0Config *this)

{
  pgraph_state *state;
  uint32_t *puVar1;
  uint uVar2;
  StateTest *pSVar3;
  uint uVar4;
  uint32_t val;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint32_t uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  bool bVar14;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
    uVar4 = uVar2 >> 0x1d & 1;
    bVar14 = (uVar2 >> 0x1c & 1) != 0;
    iVar11 = uVar4 * 0x40 + 0x40;
    if (bVar14) {
      iVar11 = 0x10;
    }
    iVar5 = 0x10a;
    if (!bVar14) {
      iVar5 = uVar4 * 0x400 + 0x50a;
    }
    if ((int)uVar2 < 0) {
      iVar11 = 0;
    }
    uVar6 = uVar2 >> 0xc & 3;
    uVar4 = uVar2 >> 10 & 3;
    iVar8 = 0x140000;
    if ((uVar2 >> 8 & 1) == 0) {
      iVar8 = 0x200000;
    }
    if (uVar4 == 3) {
      iVar8 = 0x200000;
    }
    uVar10 = 0x1c80;
    if (uVar4 == 1) {
      uVar10 = 0x3ca0;
    }
    val = 0x3c80;
    if (uVar4 != 2) {
      val = uVar10;
    }
    iVar13 = ((uVar2 & 0xf) == 2) + 1;
    uVar7 = uVar2 >> 6 & 3;
    uVar12 = uVar2 >> 4 & 3;
    uVar9 = 0x9000000;
    if (uVar12 != 0) {
      uVar9 = uVar12 << 0x18;
    }
    uVar12 = 0x90000000;
    if (uVar7 != 0) {
      uVar12 = uVar7 << 0x1c;
    }
    uVar12 = uVar9 | (uint)((uVar2 & 0xf) == 0) << 4 | uVar12;
    uVar9 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format[0] &
            0xffffef | uVar12;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format[0] = uVar9;
    pgraph_celsius_icmd(state,4,uVar9,false);
    uVar12 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format[1] &
             0xffffef | uVar12;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format[1] = uVar12;
    pgraph_celsius_icmd(state,5,uVar12,false);
    uVar7 = iVar13 * 0x1000000;
    uVar12 = iVar13 * 0x10000000;
    uVar9 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_filter[0] &
            0x88ffffff | uVar7 | uVar12;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_filter[0] = uVar9;
    pgraph_celsius_icmd(state,0xe,uVar9,false);
    uVar12 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_filter[1] &
             0x88ffffff | uVar7 | uVar12;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_filter[1] = uVar12;
    pgraph_celsius_icmd(state,0xf,uVar12,false);
    uVar10 = (uint)(uVar4 == 3) * 0x8000000 + iVar8 + 0x18000000;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_in_alpha[0] = uVar10;
    pgraph_celsius_icmd(state,0x10,uVar10,false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_in_color[0] =
         0x8040000;
    pgraph_celsius_icmd(state,0x12,0x8040000,false);
    uVar10 = (this->super_SingleMthdTest).super_MthdTest.val;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_factor_0[0] = uVar10;
    pgraph_celsius_icmd(state,0x14,uVar10,false);
    uVar10 = (this->super_SingleMthdTest).super_MthdTest.val;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_factor_1[0] = uVar10;
    pgraph_celsius_icmd(state,0x15,uVar10,false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_out_alpha[0] = 0xc00;
    pgraph_celsius_icmd(state,0x16,0xc00,false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_out_color[0] = 0xc00;
    pgraph_celsius_icmd(state,0x18,0xc00,false);
    uVar4 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_out_color[1] &
            0xc7ffffff | 0x10000000;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_out_color[1] = uVar4;
    pgraph_celsius_icmd(state,0x19,uVar4,false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_final_a = 0xc;
    pgraph_celsius_icmd(state,0x1a,0xc,false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_final_b = val;
    pgraph_celsius_icmd(state,0x1b,val,false);
    uVar4 = (this->super_SingleMthdTest).super_MthdTest.val;
    uVar9 = (uint)((uVar4 & 0x700000) != 0);
    iVar8 = 0x38000000;
    if ((uVar4 & 0x7000000) == 0) {
      iVar8 = 0;
    }
    uVar10 = iVar8 + (uVar4 + 0xf0000 & 0xf0000 |
                      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                      bundle_config_a & 0xc030bfff | (uVar4 & 0x8000) << 8 | uVar9 << 0xe |
                     uVar9 << 0x18) + 0x400000;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a = uVar10;
    pgraph_celsius_icmd(state,0x1c,uVar10,false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_a = 0x70;
    pgraph_celsius_icmd(state,0x1d,0x70,false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_b = 0x222;
    pgraph_celsius_icmd(state,0x1e,0x222,false);
    uVar4 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_b &
            0xfffffe00 | 0x1c0;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_b = uVar4;
    pgraph_celsius_icmd(state,0x1f,uVar4,false);
    iVar8 = 10;
    if ((uVar2 >> 0x1e & 1) == 0) {
      iVar8 = iVar5;
    }
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_blend = iVar8 + iVar11;
    pgraph_celsius_icmd(state,0x20,iVar8 + iVar11,false);
    uVar10 = ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster &
             0xc0000000) + ((uint)(uVar6 != 3) << 0x15 | (uint)(uVar6 != 1) << 0x1c) + 0x4200000;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster = uVar10;
    pgraph_celsius_icmd(state,0x22,uVar10,true);
    uVar10 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b;
    pSVar3 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest;
    (pSVar3->exp).celsius_pipe_junk[2] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a;
    (pSVar3->exp).celsius_pipe_junk[3] = uVar10;
  }
  puVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid + 1;
  *puVar1 = *puVar1 | 0x1020000;
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		int filt = 1;
		int origin = 0;
		int sinterp = extr(val, 0, 4);
		if (sinterp == 0)
			origin = 1;
		if (sinterp == 2)
			filt = 2;
		int wrapu = extr(val, 4, 2);
		if (wrapu == 0)
			wrapu = 9;
		int wrapv = extr(val, 6, 2);
		if (wrapv == 0)
			wrapv = 9;
		uint32_t rc_in_alpha_a = 0x18;;
		uint32_t rc_in_alpha_b = 0x14;;
		if (!extr(val, 8, 1))
			rc_in_alpha_b = 0x20;
		uint32_t rc_final_b = 0x1c80;
		int srcmode = extr(val, 10, 2);
		if (srcmode == 1)
			rc_final_b |= 0x2020;
		if (srcmode == 2)
			rc_final_b |= 0x2000;
		if (srcmode == 3) {
			rc_in_alpha_a = 0x20;
			rc_in_alpha_b = 0x20;
		}
		int scull = extr(val, 12, 2);
		int sblend = 4, dblend = 5;
		if (extr(val, 29, 1)) {
			dblend = 9;
			sblend = 8;
		}
		if (extr(val, 28, 1))
			sblend = dblend = 1;
		if (extr(val, 30, 1))
			dblend = 0;
		if (extr(val, 31, 1))
			sblend = 0;
		if (!extr(exp.nsource, 1, 1)) {
			for (int i = 0; i < 2; i++) {
				insrt(exp.bundle_tex_format[i], 4, 1, origin);
				insrt(exp.bundle_tex_format[i], 24, 4, wrapu);
				insrt(exp.bundle_tex_format[i], 28, 4, wrapv);
				pgraph_celsius_icmd(&exp, 4 + i, exp.bundle_tex_format[i], false);
			}
			for (int i = 0; i < 2; i++) {
				insrt(exp.bundle_tex_filter[i], 24, 3, filt);
				insrt(exp.bundle_tex_filter[i], 28, 3, filt);
				pgraph_celsius_icmd(&exp, 0xe + i, exp.bundle_tex_filter[i], false);
			}
			exp.bundle_rc_in_alpha[0] = rc_in_alpha_a << 24 | rc_in_alpha_b << 16;
			pgraph_celsius_icmd(&exp, 0x10, exp.bundle_rc_in_alpha[0], false);
			exp.bundle_rc_in_color[0] = 0x08040000;
			pgraph_celsius_icmd(&exp, 0x12, exp.bundle_rc_in_color[0], false);
			exp.bundle_rc_factor_0[0] = val;
			pgraph_celsius_icmd(&exp, 0x14, exp.bundle_rc_factor_0[0], false);
			exp.bundle_rc_factor_1[0] = val;
			pgraph_celsius_icmd(&exp, 0x15, exp.bundle_rc_factor_1[0], false);
			exp.bundle_rc_out_alpha[0] = 0xc00;
			pgraph_celsius_icmd(&exp, 0x16, exp.bundle_rc_out_alpha[0], false);
			exp.bundle_rc_out_color[0] = 0xc00;
			pgraph_celsius_icmd(&exp, 0x18, exp.bundle_rc_out_color[0], false);
			insrt(exp.bundle_rc_out_color[1], 27, 3, 2);
			pgraph_celsius_icmd(&exp, 0x19, exp.bundle_rc_out_color[1], false);
			exp.bundle_rc_final_a = 0xc;
			pgraph_celsius_icmd(&exp, 0x1a, exp.bundle_rc_final_a, false);
			exp.bundle_rc_final_b = rc_final_b;
			pgraph_celsius_icmd(&exp, 0x1b, exp.bundle_rc_final_b, false);
			insrt(exp.bundle_config_a, 14, 1, !!extr(val, 20, 3));
			insrt(exp.bundle_config_a, 16, 4, extr(val, 16, 4) - 1);
			insrt(exp.bundle_config_a, 22, 1, 1);
			insrt(exp.bundle_config_a, 23, 1, extr(val, 15, 1));
			insrt(exp.bundle_config_a, 24, 1, !!extr(val, 20, 3));
			insrt(exp.bundle_config_a, 25, 1, 0);
			insrt(exp.bundle_config_a, 26, 1, 0);
			insrt(exp.bundle_config_a, 27, 3, extr(val, 24, 3) ? 0x7 : 0);
			pgraph_celsius_icmd(&exp, 0x1c, exp.bundle_config_a, false);
			exp.bundle_stencil_a = 0x70;
			pgraph_celsius_icmd(&exp, 0x1d, exp.bundle_stencil_a, false);
			exp.bundle_stencil_b = 0x222;
			pgraph_celsius_icmd(&exp, 0x1e, exp.bundle_stencil_b, false);
			insrt(exp.bundle_config_b, 0, 9, 0x1c0);
			pgraph_celsius_icmd(&exp, 0x1f, exp.bundle_config_b, false);
			exp.bundle_blend = 0xa | sblend << 4 | dblend << 8;
			pgraph_celsius_icmd(&exp, 0x20, exp.bundle_blend, false);
			insrt(exp.bundle_raster, 0, 21, 0);
			insrt(exp.bundle_raster, 21, 2, scull == 3 ? 1 : 2);
			insrt(exp.bundle_raster, 23, 5, 8);
			insrt(exp.bundle_raster, 28, 2, scull != 1);
			pgraph_celsius_icmd(&exp, 0x22, exp.bundle_raster, true);
			exp.celsius_pipe_junk[2] = exp.celsius_xf_misc_a;
			exp.celsius_pipe_junk[3] = exp.celsius_xf_misc_b;
		}
		insrt(exp.valid[1], 17, 1, 1);
		insrt(exp.valid[1], 24, 1, 1);
	}